

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

void uu_encode(archive_string *as,uchar *p,size_t len)

{
  ulong in_RDX;
  long in_RSI;
  int c;
  char in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  ulong local_18;
  long local_10;
  
  archive_strappend_char
            ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4f);
  local_10 = in_RSI;
  for (local_18 = in_RDX; 2 < local_18; local_18 = local_18 - 3) {
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4f);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4f);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4f);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4f);
    local_10 = local_10 + 3;
  }
  if (local_18 != 0) {
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4f);
    if (local_18 == 1) {
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4f);
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4f);
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4f);
    }
    else {
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4f);
      if ((*(byte *)(local_10 + 1) & 0xf) == 0) {
        in_stack_ffffffffffffff54 = 0x60;
      }
      else {
        in_stack_ffffffffffffff54 = (*(byte *)(local_10 + 1) & 0xf) * 4 + 0x20;
      }
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4f);
      archive_strappend_char
                ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4f);
    }
  }
  archive_strappend_char
            ((archive_string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4f);
  return;
}

Assistant:

static void
uu_encode(struct archive_string *as, const unsigned char *p, size_t len)
{
	int c;

	c = (int)len;
	archive_strappend_char(as, c?c + 0x20:'`');
	for (; len >= 3; p += 3, len -= 3) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[0] & 0x03) << 4) | ((p[1] & 0xf0) >> 4);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = ((p[1] & 0x0f) << 2) | ((p[2] & 0xc0) >> 6);
		archive_strappend_char(as, c?c + 0x20:'`');
		c = p[2] & 0x3f;
		archive_strappend_char(as, c?c + 0x20:'`');
	}
	if (len > 0) {
		c = p[0] >> 2;
		archive_strappend_char(as, c?c + 0x20:'`');
		c = (p[0] & 0x03) << 4;
		if (len == 1) {
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
			archive_strappend_char(as, '`');
		} else {
			c |= (p[1] & 0xf0) >> 4;
			archive_strappend_char(as, c?c + 0x20:'`');
			c = (p[1] & 0x0f) << 2;
			archive_strappend_char(as, c?c + 0x20:'`');
			archive_strappend_char(as, '`');
		}
	}
	archive_strappend_char(as, '\n');
}